

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_threads.c
# Opt level: O0

int zt_threadpool_kill(zt_threadpool *tpool)

{
  ssize_t sVar1;
  long in_RDI;
  int ret;
  int k;
  int i;
  uint in_stack_ffffffffffffffe8;
  int iVar2;
  undefined4 local_10;
  int local_c;
  long local_8;
  
  local_10 = 1;
  iVar2 = 0;
  *(undefined4 *)(in_RDI + 0x4c) = 1;
  local_8 = in_RDI;
  zt_threads_cond_signal((zt_threads_cond *)(ulong)in_stack_ffffffffffffffe8,0);
  zt_threads_cond_signal((zt_threads_cond *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),0);
  for (local_c = 0; local_c < *(int *)(local_8 + 0x40); local_c = local_c + 1) {
    if (_zt_threadpool_cbs.iput_loop != (_func_void_ptr_void_ptr *)0x0) {
      zt_threads_join((zt_threads_thread *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),
                      (void **)0x1057d8);
    }
    if (_zt_threadpool_cbs.oput_loop != (_func_void_ptr_void_ptr *)0x0) {
      zt_threads_join((zt_threads_thread *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),
                      (void **)0x105801);
    }
  }
  if ((-1 < *(int *)(local_8 + 0x3c)) &&
     (sVar1 = write(*(int *)(local_8 + 0x3c),&local_10,1), sVar1 < 0)) {
    iVar2 = -1;
  }
  if ((-1 < *(int *)(local_8 + 0x34)) &&
     (sVar1 = write(*(int *)(local_8 + 0x34),&local_c,1), sVar1 < 0)) {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
zt_threadpool_kill(zt_threadpool *tpool) {
    int i;
    int k   = 1;
    int ret = 0;

    tpool->kill = 1;

    /* signal all threads, and let them die */
    zt_threads_cond_signal(tpool->iput_cond, 1);
    zt_threads_cond_signal(tpool->oput_cond, 1);

    for (i = 0; i < tpool->min_threads; i++) {
        if (_zt_threadpool_cbs.iput_loop) {
            zt_threads_join(tpool->iput_threads[i], NULL);
        }

        if (_zt_threadpool_cbs.oput_loop) {
            zt_threads_join(tpool->oput_threads[i], NULL);
        }
    }

    if (tpool->oput_fd_sigs[1] >= 0) {
        if (write(tpool->oput_fd_sigs[1], &k, 1) < 0) {
            ret = -1;
        }
    }

    if (tpool->iput_fd_sigs[1] >= 0) {
        if (write(tpool->iput_fd_sigs[1], &i, 1) < 0) {
            ret = -1;
        }
    }

    return ret;
}